

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O0

bool __thiscall level_mesh::search_colinear_path(level_mesh *this,uint32_t v0,uint32_t v1)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  reference b;
  reference pvVar4;
  _vector3<float> *p_Var5;
  float fVar6;
  value_type_conflict2 local_84;
  _vector3<float> local_80;
  _vector3<float> local_74;
  ulong local_68;
  uint_fast32_t vt;
  uint_fast32_t ix;
  b_face *face;
  uint_fast32_t next;
  uint_fast32_t vm;
  uint_fast32_t vx;
  fvector3 span;
  fvector3 px;
  uint32_t v1_local;
  uint32_t v0_local;
  level_mesh *this_local;
  
  px.field_0.field_0.y = (float)v1;
  px.field_0.field_0.z = (float)v0;
  pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,(ulong)v0);
  b = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::operator[]
                (&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                 (ulong)(uint)px.field_0.field_0.y);
  xray_re::_vector3<float>::sub((_vector3<float> *)&vx,pvVar3,b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->m_path,1,(value_type_conflict2 *)&px.field_0.field_0.y);
  vm = (uint_fast32_t)(uint)px.field_0.field_0.y;
  do {
    next = vm;
    pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
             operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,vm);
    xray_re::_vector3<float>::set<float>((_vector3<float> *)((long)&span.field_0 + 4),pvVar3);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->super_xr_mesh_builder).m_vertex_faces,vm);
    uVar1 = *pvVar4;
    while (face = (b_face *)(ulong)uVar1, face != (b_face *)0xffffffff) {
      ix = (uint_fast32_t)
           std::
           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ::operator[](&(this->super_xr_mesh_builder).m_faces,(size_type)face);
      vt = xray_re::xr_mesh_builder::b_face::local_vert_idx((b_face *)ix,vm);
      memset(&local_74,0,0xc);
      local_68 = (ulong)*(uint *)(ix + ((vt + 1) % 3) * 4);
      pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,local_68);
      p_Var5 = xray_re::_vector3<float>::sub
                         (&local_74,pvVar3,(_vector3<float> *)((long)&span.field_0 + 4));
      fVar6 = xray_re::_vector3<float>::cosine((_vector3<float> *)&vx,p_Var5);
      bVar2 = xray_re::equivalent<float>(fVar6,1.0,2e-06);
      if (bVar2) {
        next = local_68;
        break;
      }
      memset(&local_80,0,0xc);
      local_68 = (ulong)*(uint *)(ix + ((vt + 2) % 3) * 4);
      pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,local_68);
      p_Var5 = xray_re::_vector3<float>::sub
                         (&local_80,pvVar3,(_vector3<float> *)((long)&span.field_0 + 4));
      fVar6 = xray_re::_vector3<float>::cosine((_vector3<float> *)&vx,p_Var5);
      bVar2 = xray_re::equivalent<float>(fVar6,1.0,2e-06);
      if (bVar2) {
        next = local_68;
        break;
      }
      uVar1 = *(uint *)(ix + 0x24 + vt * 4);
    }
    if (next == vm) {
      return false;
    }
    local_84 = (value_type_conflict2)next;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_path,&local_84);
    if (next == (uint)px.field_0.field_0.z) {
      return true;
    }
    vm = next;
  } while( true );
}

Assistant:

bool level_mesh::search_colinear_path(uint32_t v0, uint32_t v1)
{
	fvector3 px, span;
	span.sub(m_points[v0], m_points[v1]);

	m_path.assign(1, v1);
	for (uint_fast32_t vx = v1, vm;; vx = vm) {
		px.set(m_points[vm = vx]);
		for (uint_fast32_t next = m_vertex_faces[vx]; next != BAD_IDX;) {
			const b_face& face = m_faces[next];
			uint_fast32_t ix = face.local_vert_idx(vx), vt;
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 1)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 2)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			next = face.link[ix];
		}
		if (vm == vx)
			return false;
		m_path.push_back(uint32_t(vm & UINT32_MAX));
		if (vm == v0)
			return true;
	}
	return false;
}